

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-cursor.c
# Opt level: O0

int coda_mem_cursor_goto_record_field_by_index(coda_cursor *cursor,long index)

{
  coda_dynamic_type_struct *pcVar1;
  coda_dynamic_type *pcVar2;
  coda_mem_type *type;
  long index_local;
  coda_cursor *cursor_local;
  
  pcVar1 = cursor->stack[cursor->n + -1].type;
  if (pcVar1[1].backend == coda_backend_ascii) {
    if ((index < 0) || (*(long *)(pcVar1 + 2) <= index)) {
      coda_set_error(-0x65,"field index (%ld) is not in the range [0,%ld)",index,
                     *(undefined8 *)(pcVar1 + 2));
      cursor_local._4_4_ = -1;
    }
    else {
      cursor->n = cursor->n + 1;
      if (*(long *)(&(pcVar1[2].definition)->format + index * 2) == 0) {
        pcVar2 = coda_no_data_singleton(pcVar1->definition->format);
        cursor->stack[cursor->n + -1].type = pcVar2;
      }
      else {
        cursor->stack[cursor->n + -1].type =
             *(coda_dynamic_type_struct **)(&(pcVar1[2].definition)->format + index * 2);
      }
      cursor->stack[cursor->n + -1].index = index;
      cursor->stack[cursor->n + -1].bit_offset = -1;
      cursor_local._4_4_ = 0;
    }
  }
  else {
    if (pcVar1[1].backend != 2) {
      __assert_fail("type->tag == tag_mem_data",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-cursor.c"
                    ,0x4f,"int coda_mem_cursor_goto_record_field_by_index(coda_cursor *, long)");
    }
    cursor_local._4_4_ = coda_ascbin_cursor_goto_record_field_by_index(cursor,index);
  }
  return cursor_local._4_4_;
}

Assistant:

int coda_mem_cursor_goto_record_field_by_index(coda_cursor *cursor, long index)
{
    coda_mem_type *type = (coda_mem_type *)cursor->stack[cursor->n - 1].type;

    if (type->tag == tag_mem_record)
    {
        if (index < 0 || index >= ((coda_mem_record *)type)->num_fields)
        {
            coda_set_error(CODA_ERROR_INVALID_INDEX, "field index (%ld) is not in the range [0,%ld)", index,
                           ((coda_mem_record *)type)->num_fields);
            return -1;
        }
        cursor->n++;
        if (((coda_mem_record *)type)->field_type[index] != NULL)
        {
            cursor->stack[cursor->n - 1].type = ((coda_mem_record *)type)->field_type[index];
        }
        else
        {
            cursor->stack[cursor->n - 1].type = coda_no_data_singleton(type->definition->format);
        }
        cursor->stack[cursor->n - 1].index = index;
        cursor->stack[cursor->n - 1].bit_offset = -1;

        return 0;
    }

    assert(type->tag == tag_mem_data);
    return coda_ascbin_cursor_goto_record_field_by_index(cursor, index);
}